

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::
     texture_gather_offset_sampler_2d_array_shadow(NegativeTestContext *ctx)

{
  ShaderType shaderType;
  bool bVar1;
  char *__s;
  long lVar2;
  DataType in_stack_fffffffffffffef8;
  allocator<char> local_f9;
  string shaderSource;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&shaderSource,"textureGatherOffset - sampler2DShadow",
             (allocator<char> *)&local_d0);
  NegativeTestContext::beginSection(ctx,&shaderSource);
  std::__cxx11::string::~string((string *)&shaderSource);
  for (lVar2 = 0; lVar2 != 0x18; lVar2 = lVar2 + 4) {
    shaderType = *(ShaderType *)
                  ((long)&NegativeTestShared::(anonymous_namespace)::s_shaders + lVar2);
    bVar1 = NegativeTestContext::isShaderSupported(ctx,shaderType);
    if (bVar1) {
      __s = glu::getShaderTypeName(shaderType);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,__s,&local_f9);
      std::operator+(&shaderSource,"Verify shader: ",&local_d0);
      NegativeTestContext::beginSection(ctx,&shaderSource);
      std::__cxx11::string::~string((string *)&shaderSource);
      std::__cxx11::string::~string((string *)&local_d0);
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,SHADERTYPE_FRAGMENT,0x32,TYPE_FLOAT,TYPE_INT_VEC2,TYPE_FLOAT,
                 in_stack_fffffffffffffef8);
      std::__cxx11::string::string((string *)&local_50,(string *)&shaderSource);
      verifyShader(ctx,shaderType,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&shaderSource);
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,SHADERTYPE_FRAGMENT,0x32,TYPE_FLOAT_VEC3,TYPE_INT_VEC2,TYPE_INT,
                 in_stack_fffffffffffffef8);
      std::__cxx11::string::string((string *)&local_70,(string *)&shaderSource);
      verifyShader(ctx,shaderType,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&shaderSource);
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,SHADERTYPE_FRAGMENT,0x32,TYPE_FLOAT_VEC3,TYPE_INT,TYPE_FLOAT,
                 in_stack_fffffffffffffef8);
      std::__cxx11::string::string((string *)&local_90,(string *)&shaderSource);
      verifyShader(ctx,shaderType,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&shaderSource);
      NegativeTestShared::(anonymous_namespace)::genShaderSourceTextureGatherOffset_abi_cxx11_
                (&shaderSource,(_anonymous_namespace_ *)ctx,(NegativeTestContext *)(ulong)shaderType
                 ,SHADERTYPE_FRAGMENT,0x2c,TYPE_FLOAT_VEC3,TYPE_INT_VEC2,TYPE_FLOAT,
                 in_stack_fffffffffffffef8);
      std::__cxx11::string::string((string *)&local_b0,(string *)&shaderSource);
      verifyShader(ctx,shaderType,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&shaderSource);
      NegativeTestContext::endSection(ctx);
    }
  }
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void texture_gather_offset_sampler_2d_array_shadow (NegativeTestContext& ctx)
{
	ctx.beginSection("textureGatherOffset - sampler2DShadow");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z, glu::TYPE_SAMPLER_2D_ARRAY_SHADOW, glu::TYPE_FLOAT, glu::TYPE_INT_VEC2, glu::TYPE_FLOAT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z, glu::TYPE_SAMPLER_2D_ARRAY_SHADOW, glu::TYPE_FLOAT_VEC3, glu::TYPE_INT_VEC2, glu::TYPE_INT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z, glu::TYPE_SAMPLER_2D_ARRAY_SHADOW, glu::TYPE_FLOAT_VEC3, glu::TYPE_INT, glu::TYPE_FLOAT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			{
				const std::string shaderSource(genShaderSourceTextureGatherOffset(ctx, s_shaders[shaderNdx], FUNCTION_TEXTURE_GATHER_OFFSET_MODE_REF_Z, glu::TYPE_SAMPLER_3D, glu::TYPE_FLOAT_VEC3, glu::TYPE_INT_VEC2, glu::TYPE_FLOAT));
				verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}